

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# media.h
# Opt level: O2

string * __thiscall
pbrt::CloudMediumProvider::ToString_abi_cxx11_
          (string *__return_storage_ptr__,CloudMediumProvider *this)

{
  float *unaff_RBX;
  
  StringPrintf<pbrt::Bounds3<float>const&,float_const&,float_const&,float_const&>
            (__return_storage_ptr__,
             (pbrt *)"[ CloudMediumProvider bounds: %s density: %f wispiness: %f frequency: %f ]",
             (char *)this,(Bounds3<float> *)&this->density,&this->wispiness,&this->frequency,
             unaff_RBX);
  return __return_storage_ptr__;
}

Assistant:

std::string ToString() const {
        return StringPrintf("[ CloudMediumProvider bounds: %s density: %f "
                            "wispiness: %f frequency: %f ]",
                            bounds, density, wispiness, frequency);
    }